

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O0

int SUNNonlinSolGetSysFn_FixedPoint(SUNNonlinearSolver NLS,SUNNonlinSolSysFn *SysFn)

{
  SUNNonlinSolSysFn *SysFn_local;
  SUNNonlinearSolver NLS_local;
  
  if (NLS == (SUNNonlinearSolver)0x0) {
    NLS_local._4_4_ = -1;
  }
  else {
    *SysFn = *NLS->content;
    NLS_local._4_4_ = 0;
  }
  return NLS_local._4_4_;
}

Assistant:

int SUNNonlinSolGetSysFn_FixedPoint(SUNNonlinearSolver NLS, SUNNonlinSolSysFn *SysFn)
{
  /* check that the nonlinear solver is non-null */
  if (NLS == NULL)
    return(SUN_NLS_MEM_NULL);

  /* return the nonlinear system defining function */
  *SysFn = FP_CONTENT(NLS)->Sys;
  return(SUN_NLS_SUCCESS);
}